

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,float *points,ON_BoundingBox *tight_bbox,
               int bGrowBox,ON_Xform *xform)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  ON_Xform *pOVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  double *pdVar11;
  int i;
  ON_3fPoint Q;
  double local_d8;
  double local_d0;
  ON_Xform *local_c8;
  ON_3fPoint local_b8;
  ON_BoundingBox local_a8;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  ON_BoundingBox *local_38;
  
  ON_BoundingBox::ON_BoundingBox(&local_a8);
  ON_3dPoint::ON_3dPoint((ON_3dPoint *)local_58,0.0,0.0,0.0);
  ON_3fPoint::ON_3fPoint(&local_b8,0.0,0.0,0.0);
  if ((bGrowBox == 0) || (bVar9 = ON_BoundingBox::IsNotEmpty(tight_bbox), !bVar9)) {
    dVar8 = ON_BoundingBox::EmptyBoundingBox.m_max.z;
    dVar7 = ON_BoundingBox::EmptyBoundingBox.m_max.x;
    dVar6 = ON_BoundingBox::EmptyBoundingBox.m_min.z;
    dVar4 = ON_BoundingBox::EmptyBoundingBox.m_min.y;
    dVar3 = ON_BoundingBox::EmptyBoundingBox.m_min.x;
    (tight_bbox->m_max).y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
    (tight_bbox->m_max).z = dVar8;
    (tight_bbox->m_min).z = dVar6;
    (tight_bbox->m_max).x = dVar7;
    (tight_bbox->m_min).x = dVar3;
    (tight_bbox->m_min).y = dVar4;
    bVar9 = true;
  }
  else {
    bVar9 = false;
  }
  if ((points == (float *)0x0 || (dim < 1 || count < 1)) ||
     ((count != 1 && (stride < (int)((uint)is_rat + dim))))) {
    return (bool)((bVar9 ^ 1U) & count == 0);
  }
  local_38 = tight_bbox;
  if (xform == (ON_Xform *)0x0) {
    local_c8 = (ON_Xform *)0x0;
  }
  else {
    bVar10 = ON_Xform::IsIdentity(xform,0.0);
    local_c8 = (ON_Xform *)0x0;
    if (!bVar10) {
      local_c8 = xform;
    }
  }
  i = 3;
  if ((uint)dim < 3) {
    i = dim;
  }
  bVar10 = true;
  if (is_rat) {
    fVar2 = points[(uint)dim];
    bVar10 = fVar2 != 0.0;
    if ((fVar2 == 0.0) && (!NAN(fVar2))) {
      do {
        if (count < 2) {
          return false;
        }
        count = count + -1;
        pfVar1 = points + (long)stride + (ulong)(uint)dim;
        points = points + stride;
      } while ((*pfVar1 == 0.0) && (!NAN(*pfVar1)));
    }
  }
  if (bVar9) {
    memcpy(&local_b8,points,(ulong)(uint)(i * 4));
    ON_3dPoint::operator=(&local_a8.m_min,&local_b8);
    if (is_rat) {
      dVar4 = 1.0 / (double)points[(uint)dim];
      dVar3 = dVar4 * local_a8.m_min.y;
      local_a8.m_min.y._0_4_ = SUB84(dVar3,0);
      local_a8.m_min.x = dVar4 * local_a8.m_min.x;
      local_a8.m_min.y._4_4_ = (int)((ulong)dVar3 >> 0x20);
      local_a8.m_min.z = dVar4 * local_a8.m_min.z;
    }
    if (local_c8 != (ON_Xform *)0x0) {
      ON_3dPoint::Transform(&local_a8.m_min,local_c8);
    }
    local_a8.m_max.z = local_a8.m_min.z;
    local_a8.m_max.x = local_a8.m_min.x;
    local_a8.m_max.y = local_a8.m_min.y;
    count = count + -1;
    if (count == 0) goto LAB_003e13f3;
    points = points + stride;
  }
  if (is_rat) {
    if (local_c8 == (ON_Xform *)0x0) {
      local_60 = local_a8.m_min.x;
      local_68 = local_a8.m_min.y;
      local_40 = local_a8.m_max.x;
      local_d8 = local_a8.m_max.y;
      local_70 = local_a8.m_min.z;
      local_d0 = local_a8.m_max.z;
      do {
        fVar2 = points[(uint)dim];
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          memcpy(&local_b8,points,(ulong)(uint)(i << 2));
          dVar3 = 1.0 / (double)fVar2;
          local_48 = (double)local_b8.z * dVar3;
          dVar4 = dVar3 * (double)local_b8.x;
          dVar3 = dVar3 * (double)local_b8.y;
          local_58._8_4_ = SUB84(dVar3,0);
          local_58._0_8_ = dVar4;
          local_58._12_4_ = (int)((ulong)dVar3 >> 0x20);
          if (local_60 <= dVar4) {
            if (local_40 < dVar4) {
              local_a8.m_max.x = dVar4;
              local_40 = dVar4;
            }
          }
          else {
            local_a8.m_min.x = dVar4;
            local_60 = dVar4;
          }
          if (local_68 <= dVar3) {
            pdVar11 = (double *)((long)&local_a8 + 0x20);
            dVar4 = dVar3;
            if (local_d8 < dVar3) goto LAB_003e1260;
          }
          else {
            pdVar11 = (double *)((long)&local_a8 + 8);
            dVar4 = local_d8;
            local_68 = dVar3;
LAB_003e1260:
            *pdVar11 = dVar3;
            local_d8 = dVar4;
          }
          if (local_70 <= local_48) {
            pdVar11 = (double *)((long)&local_a8 + 0x28);
            dVar3 = local_48;
            if (local_48 <= local_d0) goto LAB_003e12a7;
          }
          else {
            pdVar11 = (double *)((long)&local_a8 + 0x10);
            dVar3 = local_d0;
            local_70 = local_48;
          }
          *pdVar11 = local_48;
          local_d0 = dVar3;
        }
        else {
          bVar10 = false;
        }
LAB_003e12a7:
        count = count + -1;
        points = points + stride;
      } while (count != 0);
    }
    else {
      do {
        fVar2 = points[(uint)dim];
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          memcpy(&local_b8,points,(ulong)(uint)(i * 4));
          dVar3 = 1.0 / (double)fVar2;
          local_48 = (double)local_b8.z * dVar3;
          dVar4 = dVar3 * (double)local_b8.y;
          local_58._8_4_ = SUB84(dVar4,0);
          local_58._0_8_ = dVar3 * (double)local_b8.x;
          local_58._12_4_ = (int)((ulong)dVar4 >> 0x20);
          ON_3dPoint::Transform((ON_3dPoint *)local_58,local_c8);
          if (local_a8.m_min.x <= (double)local_58._0_8_) {
            if (local_a8.m_max.x < (double)local_58._0_8_) {
              local_a8.m_max.x = (double)local_58._0_8_;
            }
          }
          else {
            local_a8.m_min.x = (double)local_58._0_8_;
          }
          pdVar11 = (double *)((long)&local_a8 + 8);
          if (((double)local_58._8_8_ < local_a8.m_min.y) ||
             (pdVar11 = (double *)((long)&local_a8 + 0x20),
             local_a8.m_max.y < (double)local_58._8_8_)) {
            *pdVar11 = (double)local_58._8_8_;
          }
          pdVar11 = (double *)((long)&local_a8 + 0x10);
          if ((local_48 < local_a8.m_min.z) ||
             (pdVar11 = (double *)((long)&local_a8 + 0x28), local_a8.m_max.z < local_48)) {
            *pdVar11 = local_48;
          }
        }
        else {
          bVar10 = false;
        }
        count = count + -1;
        points = points + stride;
      } while (count != 0);
      if ((uint)dim < 3) {
        do {
          pdVar11 = ON_3dPoint::operator[](&local_a8.m_min,i);
          *pdVar11 = 0.0;
          pdVar11 = ON_3dPoint::operator[]((ON_3dPoint *)((long)&local_a8 + 0x18),i);
          *pdVar11 = 0.0;
          i = i + 1;
        } while (i != 3);
      }
    }
  }
  else if (local_c8 == (ON_Xform *)0x0) {
    local_d0 = local_a8.m_min.x;
    local_60 = local_a8.m_min.y;
    local_70 = local_a8.m_max.x;
    local_c8 = (ON_Xform *)local_a8.m_max.y;
    local_68 = local_a8.m_min.z;
    local_d8 = local_a8.m_max.z;
    do {
      memcpy(&local_b8,points,(ulong)(uint)(i << 2));
      dVar3 = (double)local_b8.x;
      dVar4 = (double)local_b8.y;
      local_48 = (double)local_b8.z;
      local_58._8_4_ = SUB84(dVar4,0);
      local_58._0_8_ = dVar3;
      local_58._12_4_ = (int)((ulong)dVar4 >> 0x20);
      if (local_d0 <= dVar3) {
        if (local_70 < dVar3) {
          local_a8.m_max.x = dVar3;
          local_70 = dVar3;
        }
      }
      else {
        local_a8.m_min.x = dVar3;
        local_d0 = dVar3;
      }
      if (local_60 <= dVar4) {
        pdVar11 = (double *)((long)&local_a8 + 0x20);
        pOVar5 = (ON_Xform *)dVar4;
        if ((double)local_c8 < dVar4) goto LAB_003e13a8;
      }
      else {
        pdVar11 = (double *)((long)&local_a8 + 8);
        pOVar5 = local_c8;
        local_60 = dVar4;
LAB_003e13a8:
        *pdVar11 = dVar4;
        local_c8 = pOVar5;
      }
      if (local_68 <= local_48) {
        pdVar11 = (double *)((long)&local_a8 + 0x28);
        dVar3 = local_48;
        if (local_d8 < local_48) goto LAB_003e13dd;
      }
      else {
        pdVar11 = (double *)((long)&local_a8 + 0x10);
        dVar3 = local_d8;
        local_68 = local_48;
LAB_003e13dd:
        *pdVar11 = local_48;
        local_d8 = dVar3;
      }
      count = count + -1;
      points = points + stride;
    } while (count != 0);
  }
  else {
    do {
      memcpy(&local_b8,points,(ulong)(uint)(i * 4));
      local_58._8_4_ = SUB84((double)local_b8.y,0);
      local_58._0_8_ = (double)local_b8.x;
      local_58._12_4_ = (int)((ulong)(double)local_b8.y >> 0x20);
      local_48 = (double)local_b8.z;
      ON_3dPoint::Transform((ON_3dPoint *)local_58,local_c8);
      if (local_a8.m_min.x <= (double)local_58._0_8_) {
        if (local_a8.m_max.x < (double)local_58._0_8_) {
          local_a8.m_max.x = (double)local_58._0_8_;
        }
      }
      else {
        local_a8.m_min.x = (double)local_58._0_8_;
      }
      pdVar11 = (double *)((long)&local_a8 + 8);
      if (((double)local_58._8_8_ < local_a8.m_min.y) ||
         (pdVar11 = (double *)((long)&local_a8 + 0x20), local_a8.m_max.y < (double)local_58._8_8_))
      {
        *pdVar11 = (double)local_58._8_8_;
      }
      pdVar11 = (double *)((long)&local_a8 + 0x10);
      if ((local_48 < local_a8.m_min.z) ||
         (pdVar11 = (double *)((long)&local_a8 + 0x28), local_a8.m_max.z < local_48)) {
        *pdVar11 = local_48;
      }
      count = count + -1;
      points = points + stride;
    } while (count != 0);
    if ((uint)dim < 3) {
      do {
        pdVar11 = ON_3dPoint::operator[](&local_a8.m_min,i);
        *pdVar11 = 0.0;
        pdVar11 = ON_3dPoint::operator[]((ON_3dPoint *)((long)&local_a8 + 0x18),i);
        *pdVar11 = 0.0;
        i = i + 1;
      } while (i != 3);
    }
  }
LAB_003e13f3:
  ON_BoundingBox::Union(local_38,&local_a8);
  return bVar10;
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const float* points, 
    ON_BoundingBox& tight_bbox,
    int bGrowBox,
    const ON_Xform* xform
    )
{
  // bounding box workhorse
  ON_BoundingBox bbox;
  ON_3dPoint P(0.0,0.0,0.0);
  ON_3fPoint Q(0.0,0.0,0.0);
  double w;
  int i, wi;
  bool rc = false;
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }
  if ( is_rat )
  {
    is_rat = 1;
  }

  if ( count > 0 && dim > 0 && points && (count == 1 || stride >= dim+is_rat) ) 
  {
    if ( xform && xform->IsIdentity() )
    {
      xform = 0;
    }
    wi = dim;
    if ( dim > 3 )
    {
      dim = 3;
    }

    rc = true;
    if ( is_rat ) 
    {
      // skip bogus starting points
      while ( count > 0 && points[wi] == 0.0f ) 
      {
        count--;
        points += stride;
        rc = false;
      }
      if ( count <= 0 )
        return false;
    }

    if ( !bGrowBox  )
    {
      memcpy( &Q.x, points, dim*sizeof(Q.x) );
      bbox.m_min = Q;
      if ( is_rat )
      {
        w = 1.0/points[wi];
        bbox.m_min.x *= w; bbox.m_min.y *= w; bbox.m_min.z *= w;
      }
      if ( xform )
      {
        bbox.m_min.Transform(*xform);
      }
      bbox.m_max = bbox.m_min;
      points += stride;
      count--;
      bGrowBox = true;
    }

    if ( count > 0 ) 
    {
      if ( is_rat )
      {
        // homogeneous rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            w = 1.0/w;
            P.x = w*Q.x; P.y = w*Q.y; P.z = w*Q.z;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            w = 1.0/w;
            P.x = w*Q.x; P.y = w*Q.y; P.z = w*Q.z;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            P.x = Q.x; P.y = Q.y; P.z = Q.z;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &Q.x, points, dim*sizeof(Q.x) );
            P.x = Q.x; P.y = Q.y; P.z = Q.z;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
    }

    tight_bbox.Union(bbox);
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = (0 == count);
  }

  return rc;
}